

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int_type __thiscall
nlohmann::detail::input_buffer_adapter::get_character(input_buffer_adapter *this)

{
  char_type *__c;
  bool bVar1;
  input_buffer_adapter *this_local;
  
  if (this->cursor < this->limit) {
    bVar1 = false;
    if (this->cursor != (char *)0x0) {
      bVar1 = this->limit != (char *)0x0;
    }
    if (!bVar1) {
      __assert_fail("cursor != nullptr and limit != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/./nlohmann/json.hpp"
                    ,0xfac,
                    "virtual std::char_traits<char>::int_type nlohmann::detail::input_buffer_adapter::get_character()"
                   );
    }
    __c = this->cursor;
    this->cursor = __c + 1;
    this_local._4_4_ = std::char_traits<char>::to_int_type(__c);
  }
  else {
    this_local._4_4_ = std::char_traits<char>::eof();
  }
  return this_local._4_4_;
}

Assistant:

std::char_traits<char>::int_type get_character() noexcept override
    {
        if (JSON_HEDLEY_LIKELY(cursor < limit))
        {
            assert(cursor != nullptr and limit != nullptr);
            return std::char_traits<char>::to_int_type(*(cursor++));
        }

        return std::char_traits<char>::eof();
    }